

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::~cmGeneratorTarget(cmGeneratorTarget *this)

{
  cmGeneratorTarget *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->MaxLanguageStandards);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~map(&this->LanguageStandardMap);
  std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
            (&this->UtilityItems);
  std::
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->OutputNameMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>_>
  ::~map(&this->ModuleDefinitionInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
  ::~map(&this->OutputInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
  ::~map(&this->LinkImplUsageRequirementsOnlyMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
  ::~map(&this->LinkImplMap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~unordered_map(&this->ISPCGeneratedObjects);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~unordered_map(&this->ISPCGeneratedHeaders);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&this->UnityBatchedSourceFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->PchUseCompileOptions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->PchCreateCompileOptions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->PchFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->PchObjectFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->PchSources);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->PchHeaders);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->LinkImplicitNullProperties);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->SourceEntries);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->PrecompileHeadersEntries);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->LinkDirectoriesEntries);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->LinkOptionsEntries);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->CompileDefinitionsEntries);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->CompileFeaturesEntries);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->CompileOptionsEntries);
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::~vector(&this->IncludeDirectoriesEntries);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~unordered_map(&this->MaybeInterfacePropertyExists);
  std::
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>::
  ~vector(&this->AllConfigSources);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
  ::~map(&this->KindedSourcesMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
  ::~map(&this->ImportInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap>_>_>
  ::~map(&this->LinkInterfaceUsageRequirementsOnlyMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap>_>_>
  ::~map(&this->LinkInterfaceMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure>_>_>
  ::~map(&this->LinkImplClosureMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>_>
  ::~map(&this->LinkInformation);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces>_>_>
  ::~map(&this->CompatibleInterfacesMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>_>
  ::~map(&this->LinkClosureMap);
  std::__cxx11::string::~string((string *)&this->LinkerLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map(&this->DebugCompatiblePropertiesDone);
  std::
  map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
  ::~map(&this->SourceFlagsMap);
  std::__cxx11::string::~string((string *)&this->ExportMacro);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map(&this->SystemIncludesCache);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<cmTarget_*,_bool,_std::hash<cmTarget_*>,_std::equal_to<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_bool>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<cmTarget_*,_bool,_std::hash<cmTarget_*>,_std::equal_to<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_bool>_>_>_>_>_>
  ::~unordered_map(&this->MacOSXRpathInstallNameDirCache);
  std::
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::~set(&this->ExplicitObjectName);
  std::
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->Objects);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->VisitedConfigsForObjects);
  std::
  map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
  ::~map(&this->SourceDepends);
  std::__cxx11::string::~string((string *)&this->FortranModuleDirectory);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
  ::~map(&this->CompileInfoMap);
  std::__cxx11::string::~string((string *)&this->ObjectDirectory);
  return;
}

Assistant:

cmGeneratorTarget::~cmGeneratorTarget() = default;